

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevutil.cpp
# Opt level: O3

ParsedSpecification *
QEvdevUtil::parseSpecification(ParsedSpecification *__return_storage_ptr__,QString *specification)

{
  longlong lVar1;
  QChar *pQVar2;
  char cVar3;
  QStringView *arg;
  QArrayData *pQVar4;
  long lVar5;
  long in_FS_OFFSET;
  QLatin1String QVar6;
  qsizetype local_60;
  char16_t *local_58;
  QArrayDataPointer<QStringView> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->args).d.d = (Data *)0x0;
  (__return_storage_ptr__->args).d.ptr = (QStringView *)0x0;
  (__return_storage_ptr__->devices).d.ptr = (QString *)0x0;
  (__return_storage_ptr__->devices).d.size = 0;
  (__return_storage_ptr__->spec).d.size = 0;
  (__return_storage_ptr__->devices).d.d = (Data *)0x0;
  (__return_storage_ptr__->spec).d.d = (Data *)0x0;
  (__return_storage_ptr__->spec).d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->args).d.size = 0;
  local_58 = (specification->d).ptr;
  local_60 = (specification->d).size;
  QStringView::split(&local_50,&local_60,0x3a,0,1);
  QArrayDataPointer<QStringView>::operator=(&(__return_storage_ptr__->args).d,&local_50);
  if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d)->super_QArrayData,0x10,0x10);
    }
  }
  lVar5 = (__return_storage_ptr__->args).d.size;
  if (lVar5 != 0) {
    pQVar4 = (QArrayData *)(__return_storage_ptr__->args).d.ptr;
    lVar5 = lVar5 << 4;
    do {
      lVar1._0_4_ = pQVar4->ref_;
      lVar1._4_4_ = pQVar4->flags;
      pQVar2 = (QChar *)pQVar4->alloc;
      QVar6.m_data = "/dev/";
      QVar6.m_size = 5;
      cVar3 = QtPrivate::startsWith((QStringView)*pQVar4,QVar6,CaseSensitive);
      if (cVar3 == '\0') {
        local_50.ptr._0_2_ = 0x3a;
        local_50.d = (Data *)pQVar4;
        operator+=(&__return_storage_ptr__->spec,
                   (QStringBuilder<const_QStringView_&,_char16_t> *)&local_50);
      }
      else {
        QString::QString((QString *)&local_50,pQVar2,lVar1);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&__return_storage_ptr__->devices,
                   (__return_storage_ptr__->devices).d.size,(QString *)&local_50);
        QList<QString>::end(&__return_storage_ptr__->devices);
        if (&(local_50.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d)->super_QArrayData,2,0x10);
          }
        }
      }
      pQVar4 = pQVar4 + 1;
      lVar5 = lVar5 + -0x10;
    } while (lVar5 != 0);
  }
  if ((__return_storage_ptr__->spec).d.size != 0) {
    QString::chop((longlong)__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ParsedSpecification parseSpecification(const QString &specification)
{
    ParsedSpecification result;

    result.args = QStringView{specification}.split(u':');

    for (const auto &arg : std::as_const(result.args)) {
        if (arg.startsWith("/dev/"_L1)) {
            // if device is specified try to use it
            result.devices.append(arg.toString());
#ifdef Q_OS_VXWORKS
        } else if (arg.startsWith("/input/"_L1)) {
            result.devices.append(arg.toString());
#endif
        } else {
            // build new specification without /dev/ elements
            result.spec += arg + u':';
        }
    }

    if (!result.spec.isEmpty())
        result.spec.chop(1); // remove trailing ':'

    return result;
}